

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_58a0d::tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float>::mnpack
          (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  lVar1 = m - m0;
  lVar6 = 4;
  if (lVar1 < 4) {
    lVar6 = lVar1;
  }
  do {
    uVar4 = n - n0;
    uVar2 = 4;
    if ((long)uVar4 < 4) {
      uVar2 = uVar4;
    }
    uVar2 = uVar2 | lVar6 << 4;
    switch(uVar2) {
    case 0x11:
      (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<1,1>
                ((tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *)this,m0,m,n0,n);
      lVar3 = 1;
      lVar5 = 1;
      break;
    case 0x12:
      (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<1,2>
                ((tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *)this,m0,m,n0,n);
      lVar5 = 1;
      goto LAB_00162a5d;
    case 0x13:
      (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<1,3>
                ((tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *)this,m0,m,n0,n);
      lVar5 = 1;
      goto LAB_00162a7f;
    case 0x14:
      gemmMx4<1>(this,m0,m,n0,n);
      lVar5 = 1;
      goto LAB_001629cf;
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
switchD_00162858_caseD_35:
      return;
    case 0x21:
      (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<2,1>
                ((tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *)this,m0,m,n0,n);
      lVar5 = 2;
      goto LAB_00162a3b;
    case 0x22:
      (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<2,2>
                ((tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *)this,m0,m,n0,n);
      lVar3 = 2;
      lVar5 = 2;
      break;
    case 0x23:
      (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<2,3>
                ((tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *)this,m0,m,n0,n);
      lVar5 = 2;
LAB_00162a7f:
      lVar3 = 3;
      break;
    case 0x24:
      gemmMx4<2>(this,m0,m,n0,n);
      lVar5 = 2;
LAB_001629cf:
      lVar3 = 4;
      break;
    default:
      switch(uVar2) {
      case 0x31:
        (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<3,1>
                  ((tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *)this,m0,m,n0,n);
        lVar5 = 3;
        goto LAB_00162a3b;
      case 0x32:
        (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<3,2>
                  ((tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *)this,m0,m,n0,n);
        lVar5 = 3;
        goto LAB_00162a5d;
      case 0x33:
        (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<3,3>
                  ((tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *)this,m0,m,n0,n);
        lVar3 = 3;
        lVar5 = 3;
        break;
      case 0x34:
        gemmMx4<3>(this,m0,m,n0,n);
        lVar5 = 3;
        goto LAB_001629cf;
      default:
        goto switchD_00162858_caseD_35;
      case 0x41:
        gemm4xN<1>(this,m0,m,n0,n);
        lVar5 = 4;
LAB_00162a3b:
        lVar3 = 1;
        break;
      case 0x42:
        gemm4xN<2>(this,m0,m,n0,n);
        lVar5 = 4;
LAB_00162a5d:
        lVar3 = 2;
        break;
      case 0x43:
        gemm4xN<3>(this,m0,m,n0,n);
        lVar5 = 4;
        goto LAB_00162a7f;
      case 0x44:
        gemm4xN<4>(this,m0,m,n0,n);
        lVar3 = 4;
        lVar5 = 4;
      }
    }
    lVar3 = (uVar4 - (long)uVar4 % lVar3) + n0;
    mnpack(this,m - lVar1 % lVar5,m,n0,lVar3);
    n0 = lVar3;
  } while( true );
}

Assistant:

void mnpack(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t mc, nc, mp, np;
        switch ((MIN(m - m0, 4) << 4) | MIN(n - n0, 4)) {
#if VECTOR_REGISTERS == 32
        case 0x44:
            mc = 4;
            nc = 4;
#if defined(__AVX2__) && defined(__F16C__)
            gemm4xN<4>(m0, m, n0, n);
#else
            gemm<4, 4>(m0, m, n0, n);
#endif
            break;
        case 0x43:
            mc = 4;
            nc = 3;
#if defined(__AVX2__) && defined(__F16C__)
            gemm4xN<3>(m0, m, n0, n);
#else
            gemm<4, 3>(m0, m, n0, n);
#endif
            break;
        case 0x34:
            mc = 3;
            nc = 4;
#if defined(__AVX2__) && defined(__F16C__)
            gemmMx4<3>(m0, m, n0, n);
#else
            gemm<3, 4>(m0, m, n0, n);
#endif
            break;
        case 0x33:
            mc = 3;
            nc = 3;
            gemm<3, 3>(m0, m, n0, n);
            break;
        case 0x42:
            mc = 4;
            nc = 2;
#if defined(__AVX2__) && defined(__F16C__)
            gemm4xN<2>(m0, m, n0, n);
#else
            gemm<4, 2>(m0, m, n0, n);
#endif
            break;
        case 0x24:
            mc = 2;
            nc = 4;
#if defined(__AVX2__) && defined(__F16C__)
            gemmMx4<2>(m0, m, n0, n);
#else
            gemm<2, 4>(m0, m, n0, n);
#endif
            break;
#else
        case 0x44:
        case 0x43:
        case 0x42:
            mc = 4;
            nc = 2;
#if defined(__AVX2__) && defined(__F16C__)
            gemm4xN<2>(m0, m, n0, n);
#else
            gemm<4, 2>(m0, m, n0, n);
#endif
            break;
        case 0x34:
        case 0x24:
            mc = 2;
            nc = 4;
#if defined(__AVX2__) && defined(__F16C__)
            gemmMx4<2>(m0, m, n0, n);
#else
            gemm<2, 4>(m0, m, n0, n);
#endif
            break;
        case 0x33:
#endif
        case 0x32:
            mc = 3;
            nc = 2;
            gemm<3, 2>(m0, m, n0, n);
            break;
        case 0x23:
            mc = 2;
            nc = 3;
            gemm<2, 3>(m0, m, n0, n);
            break;
        case 0x41:
            mc = 4;
            nc = 1;
#if defined(__AVX2__) && defined(__F16C__)
            gemm4xN<1>(m0, m, n0, n);
#else
            gemm<4, 1>(m0, m, n0, n);
#endif
            break;
        case 0x22:
            mc = 2;
            nc = 2;
            gemm<2, 2>(m0, m, n0, n);
            break;
        case 0x14:
            mc = 1;
            nc = 4;
#if defined(__AVX2__) && defined(__F16C__)
            gemmMx4<1>(m0, m, n0, n);
#else
            gemm<1, 4>(m0, m, n0, n);
#endif
            break;
        case 0x31:
            mc = 3;
            nc = 1;
            gemm<3, 1>(m0, m, n0, n);
            break;
        case 0x13:
            mc = 1;
            nc = 3;
            gemm<1, 3>(m0, m, n0, n);
            break;
        case 0x21:
            mc = 2;
            nc = 1;
            gemm<2, 1>(m0, m, n0, n);
            break;
        case 0x12:
            mc = 1;
            nc = 2;
            gemm<1, 2>(m0, m, n0, n);
            break;
        case 0x11:
            mc = 1;
            nc = 1;
            gemm<1, 1>(m0, m, n0, n);
            break;
        default:
            return;
        }
        mp = m0 + (m - m0) / mc * mc;
        np = n0 + (n - n0) / nc * nc;
        mnpack(mp, m, n0, np);
        mnpack(m0, m, np, n);
    }